

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O3

void mcpl_recalc_psize(mcpl_outfile_t of)

{
  double dVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = *(int *)((long)of.internal + 0x50);
  iVar3 = 0x1c;
  if (iVar2 == 0) {
    iVar3 = 0x38;
  }
  *(int *)((long)of.internal + 0x70) = iVar3;
  if (*(int *)((long)of.internal + 0x4c) != 0) {
    iVar3 = 0x28;
    if (iVar2 == 0) {
      iVar3 = 0x50;
    }
    *(int *)((long)of.internal + 0x70) = iVar3;
  }
  if (*(int *)((long)of.internal + 0x54) == 0) {
    iVar3 = iVar3 + 4;
    *(int *)((long)of.internal + 0x70) = iVar3;
  }
  dVar1 = *(double *)((long)of.internal + 0x58);
  if ((dVar1 == 0.0) && (!NAN(dVar1))) {
    iVar3 = iVar3 + (uint)(iVar2 == 0) * 4 + 4;
    *(int *)((long)of.internal + 0x70) = iVar3;
  }
  if (*(int *)((long)of.internal + 0x48) != 0) {
    *(int *)((long)of.internal + 0x70) = iVar3 + 4;
  }
  *(uint *)((long)of.internal + 0x80) =
       *(int *)((long)of.internal + 0x48) * 0x10 +
       iVar2 + *(int *)((long)of.internal + 0x4c) * 2 +
       (uint)(*(int *)((long)of.internal + 0x54) != 0) * 4 + (-(uint)(dVar1 != 0.0) & 1) * 8;
  return;
}

Assistant:

MCPL_LOCAL void mcpl_recalc_psize(mcpl_outfile_t of)
{
  MCPLIMP_OUTFILEDECODE;
  unsigned fp = f->opt_singleprec ? sizeof(float) : sizeof(double);
  f->particle_size = 7*fp;
  if (f->opt_polarisation)
    f->particle_size += 3*fp;
  if (!f->opt_universalpdgcode)
    f->particle_size += sizeof(int32_t);
  if (!f->opt_universalweight)
    f->particle_size += fp;
  if (f->opt_userflags)
    f->particle_size += sizeof(uint32_t);
  if ( ! (f->particle_size<=MCPLIMP_MAX_PARTICLE_SIZE) )
    mcpl_error("unexpected particle size");
  f->opt_signature = 0
    + 1 * f->opt_singleprec
    + 2 * f->opt_polarisation
    + 4 * (f->opt_universalpdgcode?1:0)
    + 8 * (f->opt_universalweight?1:0)
    + 16 * f->opt_userflags;
}